

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall obs::safe_list<Observer>::node::unlock_all(node *this)

{
  iterator *this_00;
  bool bVar1;
  iterator **ppiVar2;
  
  bVar1 = in_creator_thread(this);
  if (bVar1) {
    ppiVar2 = &this->creator_thread_iterator;
    while (this_00 = *ppiVar2, this_00 != (iterator *)0x0) {
      iterator::notify_unlock(this_00,this);
      if (this->locks < 1) {
        __assert_fail("locks > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                      ,0x1c9,"void obs::safe_list<Observer>::node::unlock_all() [T = Observer]");
      }
      this->locks = this->locks + -1;
      ppiVar2 = &this_00->m_next_iterator;
    }
    this->creator_thread_iterator = (iterator *)0x0;
  }
  return;
}

Assistant:

void safe_list<T>::node::unlock_all() {
  if (in_creator_thread()) {
    // Notify to all iterators in the creator thread that they don't
    // have the node locked anymore. In this way we can continue the
    // erase() call.
    for (auto it=creator_thread_iterator; it; it=it->m_next_iterator) {
      it->notify_unlock(this);

      assert(locks > 0);
      --locks;
    }
    creator_thread_iterator = nullptr;
  }
}